

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcStructuralLinearAction::~IfcStructuralLinearAction
          (IfcStructuralLinearAction *this)

{
  undefined1 *puVar1;
  
  *(undefined8 *)
   &this[-1].super_IfcStructuralAction.super_IfcStructuralActivity.super_IfcProduct.super_IfcObject.
    field_0x48 = 0x8d2760;
  *(undefined8 *)
   &(this->super_IfcStructuralAction).super_IfcStructuralActivity.super_IfcProduct.super_IfcObject.
    field_0x30 = 0x8d2878;
  *(undefined8 *)
   &this[-1].super_IfcStructuralAction.super_IfcStructuralActivity.super_IfcProduct.super_IfcObject.
    field_0xd0 = 0x8d2788;
  *(undefined8 *)
   &this[-1].super_IfcStructuralAction.super_IfcStructuralActivity.super_IfcProduct.super_IfcObject.
    field_0xe0 = 0x8d27b0;
  this[-1].super_IfcStructuralAction.super_IfcStructuralActivity.GlobalOrLocal._M_dataplus._M_p =
       (pointer)0x8d27d8;
  *(undefined8 *)&this[-1].super_IfcStructuralAction.super_IfcStructuralActivity.field_0x148 =
       0x8d2800;
  *(undefined8 *)&this[-1].super_IfcStructuralAction.field_0x180 = 0x8d2828;
  *(undefined8 *)
   &(this->super_IfcStructuralAction).super_IfcStructuralActivity.super_IfcProduct.super_IfcObject =
       0x8d2850;
  puVar1 = *(undefined1 **)
            &(this->super_IfcStructuralAction).super_IfcStructuralActivity.super_IfcProduct.
             super_IfcObject.field_0x10;
  if (puVar1 != &(this->super_IfcStructuralAction).super_IfcStructuralActivity.super_IfcProduct.
                 super_IfcObject.field_0x20) {
    operator_delete(puVar1);
  }
  puVar1 = &this[-1].super_IfcStructuralAction.super_IfcStructuralActivity.super_IfcProduct.
            super_IfcObject.field_0x48;
  *(undefined8 *)
   &this[-1].super_IfcStructuralAction.super_IfcStructuralActivity.super_IfcProduct.super_IfcObject.
    field_0x48 = 0x8d2a28;
  *(undefined8 *)
   &(this->super_IfcStructuralAction).super_IfcStructuralActivity.super_IfcProduct.super_IfcObject.
    field_0x30 = 0x8d2b18;
  *(undefined8 *)
   &this[-1].super_IfcStructuralAction.super_IfcStructuralActivity.super_IfcProduct.super_IfcObject.
    field_0xd0 = 0x8d2a50;
  *(undefined8 *)
   &this[-1].super_IfcStructuralAction.super_IfcStructuralActivity.super_IfcProduct.super_IfcObject.
    field_0xe0 = 0x8d2a78;
  this[-1].super_IfcStructuralAction.super_IfcStructuralActivity.GlobalOrLocal._M_dataplus._M_p =
       "ZBS";
  *(undefined8 *)&this[-1].super_IfcStructuralAction.super_IfcStructuralActivity.field_0x148 =
       0x8d2ac8;
  *(undefined8 *)&this[-1].super_IfcStructuralAction.field_0x180 = 0x8d2af0;
  if (*(undefined1 **)&this[-1].field_0x190 != &this[-1].field_0x1a0) {
    operator_delete(*(undefined1 **)&this[-1].field_0x190);
  }
  IfcStructuralActivity::~IfcStructuralActivity
            ((IfcStructuralActivity *)puVar1,&PTR_construction_vtable_24__008d2898);
  operator_delete(puVar1);
  return;
}

Assistant:

IfcStructuralLinearAction() : Object("IfcStructuralLinearAction") {}